

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Action_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::IO_Action_PDU::IO_Action_PDU(IO_Action_PDU *this)

{
  IO_Header::IO_Header(&this->super_IO_Header);
  (this->super_IO_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__IO_Action_PDU_003363c0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_RecEntityID);
  this->m_ui32ReqId = 0;
  this->m_ui16WrTyp = 0;
  this->m_ui16SimSrc = 0;
  this->m_ui16ActTyp = 0;
  this->m_ui16ActPhs = 0;
  this->m_ui32Padding = 0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_AtkEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_TgtEntityID);
  this->m_ui16Padding = 0;
  this->m_ui16NumStdVarRec = 0;
  (this->m_vStdVarRecs).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vStdVarRecs).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vStdVarRecs).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_IO_Header).super_Header.super_Header6.m_ui8PDUType = 'F';
  (this->super_IO_Header).super_Header.super_Header6.m_ui16PDULength = 0x38;
  return;
}

Assistant:

IO_Action_PDU::IO_Action_PDU() :
    m_ui32ReqId( 0 ),
    m_ui16WrTyp( 0 ),
    m_ui16SimSrc( 0 ),
    m_ui16ActTyp( 0 ),
    m_ui16ActPhs( 0 ),
    m_ui32Padding( 0 ),
    m_ui16Padding( 0 ),
    m_ui16NumStdVarRec( 0 )
{
    m_ui8PDUType = IO_Action_PDU_Type;
    m_ui16PDULength = IO_ACTION_PDU_SIZE;
}